

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlNodeBufGetContent(xmlBufferPtr buffer,xmlNode *cur)

{
  int iVar1;
  xmlBufPtr buf;
  xmlBufferPtr pxVar2;
  
  if (buffer == (xmlBufferPtr)0x0 || cur == (xmlNode *)0x0) {
    return -1;
  }
  buf = xmlBufFromBuffer(buffer);
  iVar1 = xmlBufGetNodeContent(buf,cur);
  pxVar2 = xmlBufBackToBuffer(buf);
  return -(uint)(pxVar2 == (xmlBufferPtr)0x0 || iVar1 < 0);
}

Assistant:

int
xmlNodeBufGetContent(xmlBufferPtr buffer, const xmlNode *cur)
{
    xmlBufPtr buf;
    int ret;

    if ((cur == NULL) || (buffer == NULL)) return(-1);
    buf = xmlBufFromBuffer(buffer);
    ret = xmlBufGetNodeContent(buf, cur);
    buffer = xmlBufBackToBuffer(buf);
    if ((ret < 0) || (buffer == NULL))
        return(-1);
    return(0);
}